

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

GLuint QOpenGLTexture::boundTextureId(BindingTarget target)

{
  QOpenGLFunctions *this;
  undefined4 in_EDI;
  long in_FS_OFFSET;
  QOpenGLContext *ctx;
  GLint textureId;
  undefined4 in_stack_ffffffffffffffb8;
  GLenum in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  GLuint GVar1;
  undefined4 in_stack_ffffffffffffffd4;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QOpenGLFunctions *)QOpenGLContext::currentContext();
  if (this == (QOpenGLFunctions *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT44(in_EDI,in_stack_ffffffffffffffc8),0,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    QMessageLogger::warning
              (local_28,"QOpenGLTexture::boundTextureId() requires a valid current context");
    GVar1 = 0;
  }
  else {
    GVar1 = 0;
    QOpenGLContext::functions();
    QOpenGLFunctions::glGetIntegerv(this,in_stack_ffffffffffffffbc,(GLint *)0x18c61f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return GVar1;
  }
  __stack_chk_fail();
}

Assistant:

GLuint QOpenGLTexture::boundTextureId(BindingTarget target)
{
    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (!ctx) {
        qWarning("QOpenGLTexture::boundTextureId() requires a valid current context");
        return 0;
    }

    GLint textureId = 0;
    ctx->functions()->glGetIntegerv(target, &textureId);
    return static_cast<GLuint>(textureId);
}